

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::File>::mapping(IO *IO,File *File)

{
  File *File_local;
  IO *IO_local;
  
  yaml::IO::mapRequired<llvm::StringRef>(IO,"Name",&File->Name);
  yaml::IO::mapRequired<unsigned_long>(IO,"DirIdx",&File->DirIdx);
  yaml::IO::mapRequired<unsigned_long>(IO,"ModTime",&File->ModTime);
  yaml::IO::mapRequired<unsigned_long>(IO,"Length",&File->Length);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::File>::mapping(IO &IO, DWARFYAML::File &File) {
  IO.mapRequired("Name", File.Name);
  IO.mapRequired("DirIdx", File.DirIdx);
  IO.mapRequired("ModTime", File.ModTime);
  IO.mapRequired("Length", File.Length);
}